

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer_next.cpp
# Opt level: O0

unique_ptr<pfederc::Token,_std::default_delete<pfederc::Token>_> __thiscall
pfederc::Lexer::nextTokenEOF(Lexer *this)

{
  long lVar1;
  long lVar2;
  Lexer *in_RSI;
  Position local_50;
  Position local_38;
  undefined2 local_1a;
  Lexer *this_local;
  
  local_1a = 2;
  this_local = this;
  getCurrentCursor(&local_50,in_RSI);
  getFileContent_abi_cxx11_(in_RSI);
  lVar1 = std::__cxx11::string::length();
  getFileContent_abi_cxx11_(in_RSI);
  lVar2 = std::__cxx11::string::length();
  Position::Position(&local_38,local_50.line,lVar1 - 1,lVar2 - 1);
  std::make_unique<pfederc::Token,pfederc::Token*&,pfederc::TokenType,pfederc::Position>
            ((Token **)this,(TokenType *)&in_RSI->currentToken,(Position *)&local_1a);
  return (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)
         (__uniq_ptr_data<pfederc::Token,_std::default_delete<pfederc::Token>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Token> Lexer::nextTokenEOF() noexcept {
  return std::make_unique<Token>(currentToken, TokenType::TOK_EOF, 
    Position{getCurrentCursor().line, getFileContent().length() - 1,
      getFileContent().length() - 1});
}